

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O3

DdNode * Llb_Nonlin4ComputeBad(DdManager *dd,Aig_Man_t *pAig,Vec_Int_t *vOrder)

{
  void *pvVar1;
  ulong uVar2;
  int iVar3;
  DdNode *pDVar4;
  Vec_Ptr_t *pVVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  long lVar8;
  
  Aig_ManCleanData(pAig);
  pDVar4 = Cudd_ReadOne(dd);
  (pAig->pConst1->field_5).pData = pDVar4;
  pVVar5 = pAig->vCis;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      pvVar1 = pVVar5->pArray[lVar8];
      iVar3 = *(int *)((long)pvVar1 + 0x24);
      if (((long)iVar3 < 0) || (vOrder->nSize <= iVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pDVar4 = Cudd_bddIthVar(dd,vOrder->pArray[iVar3]);
      *(DdNode **)((long)pvVar1 + 0x28) = pDVar4;
      lVar8 = lVar8 + 1;
      pVVar5 = pAig->vCis;
    } while (lVar8 < pVVar5->nSize);
  }
  pVVar5 = Aig_ManDfsNodes(pAig,(Aig_Obj_t **)pAig->vCos->pArray,pAig->nTruePos);
  iVar3 = pVVar5->nSize;
  if (0 < iVar3) {
    lVar8 = 0;
LAB_007e5564:
    pvVar1 = pVVar5->pArray[lVar8];
    if ((*(uint *)((long)pvVar1 + 0x18) & 7) - 7 < 0xfffffffe) goto LAB_007e55c2;
    pDVar4 = Cudd_bddAnd(dd,(DdNode *)
                            ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^
                            *(ulong *)((*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe) + 0x28)),
                         (DdNode *)
                         ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^
                         *(ulong *)((*(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe) + 0x28)))
    ;
    if (pDVar4 != (DdNode *)0x0) {
      Cudd_Ref(pDVar4);
      *(DdNode **)((long)pvVar1 + 0x28) = pDVar4;
      iVar3 = pVVar5->nSize;
      goto LAB_007e55c2;
    }
    iVar3 = pVVar5->nSize;
    if (0 < iVar3) {
      lVar8 = 0;
      do {
        if ((0xfffffffd < (*(uint *)((long)pVVar5->pArray[lVar8] + 0x18) & 7) - 7) &&
           (pDVar4 = *(DdNode **)((long)pVVar5->pArray[lVar8] + 0x28), pDVar4 != (DdNode *)0x0)) {
          Cudd_RecursiveDeref(dd,pDVar4);
          iVar3 = pVVar5->nSize;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < iVar3);
    }
    if (pVVar5->pArray != (void **)0x0) {
      free(pVVar5->pArray);
    }
    free(pVVar5);
    goto LAB_007e57e1;
  }
LAB_007e55cd:
  pDVar4 = Cudd_ReadLogicZero(dd);
  Cudd_Ref(pDVar4);
  if (0 < pAig->nTruePos) {
    lVar8 = 0;
    pDVar6 = pDVar4;
    do {
      if (pAig->vCos->nSize <= lVar8) goto LAB_007e5815;
      uVar2 = *(ulong *)((long)pAig->vCos->pArray[lVar8] + 8);
      pDVar4 = Cudd_bddOr(dd,pDVar6,
                          (DdNode *)
                          ((ulong)((uint)uVar2 & 1) ^
                          *(ulong *)((uVar2 & 0xfffffffffffffffe) + 0x28)));
      if (pDVar4 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,pDVar6);
        pDVar4 = (DdNode *)0x0;
        break;
      }
      Cudd_Ref(pDVar4);
      Cudd_RecursiveDeref(dd,pDVar6);
      lVar8 = lVar8 + 1;
      pDVar6 = pDVar4;
    } while (lVar8 < pAig->nTruePos);
  }
  iVar3 = pVVar5->nSize;
  if (0 < iVar3) {
    lVar8 = 0;
    do {
      if ((0xfffffffd < (*(uint *)((long)pVVar5->pArray[lVar8] + 0x18) & 7) - 7) &&
         (pDVar6 = *(DdNode **)((long)pVVar5->pArray[lVar8] + 0x28), pDVar6 != (DdNode *)0x0)) {
        Cudd_RecursiveDeref(dd,pDVar6);
        iVar3 = pVVar5->nSize;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar3);
  }
  if (pVVar5->pArray != (void **)0x0) {
    free(pVVar5->pArray);
  }
  free(pVVar5);
  if (pDVar4 == (DdNode *)0x0) {
LAB_007e57e1:
    pDVar7 = (DdNode *)0x0;
  }
  else {
    pDVar6 = Cudd_ReadOne(dd);
    Cudd_Ref(pDVar6);
    if (0 < pAig->nTruePis) {
      lVar8 = 0;
      pDVar7 = pDVar6;
      do {
        if (pAig->vCis->nSize <= lVar8) {
LAB_007e5815:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pDVar6 = Cudd_bddAnd(dd,pDVar7,*(DdNode **)((long)pAig->vCis->pArray[lVar8] + 0x28));
        if (pDVar6 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,pDVar7);
          Cudd_RecursiveDeref(dd,pDVar4);
          goto LAB_007e57e1;
        }
        Cudd_Ref(pDVar6);
        Cudd_RecursiveDeref(dd,pDVar7);
        lVar8 = lVar8 + 1;
        pDVar7 = pDVar6;
      } while (lVar8 < pAig->nTruePis);
    }
    pDVar7 = Cudd_bddExistAbstract(dd,pDVar4,pDVar6);
    Cudd_Ref(pDVar7);
    Cudd_RecursiveDeref(dd,pDVar4);
    Cudd_RecursiveDeref(dd,pDVar6);
    Cudd_Deref(pDVar7);
  }
  return pDVar7;
LAB_007e55c2:
  lVar8 = lVar8 + 1;
  if (iVar3 <= lVar8) goto LAB_007e55cd;
  goto LAB_007e5564;
}

Assistant:

DdNode * Llb_Nonlin4ComputeBad( DdManager * dd, Aig_Man_t * pAig, Vec_Int_t * vOrder )
{
    Vec_Ptr_t * vNodes;
    DdNode * bBdd, * bBdd0, * bBdd1, * bTemp, * bResult, * bCube;
    Aig_Obj_t * pObj;
    int i;
    Aig_ManCleanData( pAig );
    // assign elementary variables
    Aig_ManConst1(pAig)->pData = Cudd_ReadOne(dd); 
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) );
    // compute internal nodes
    vNodes = Aig_ManDfsNodes( pAig, (Aig_Obj_t **)Vec_PtrArray(pAig->vCos), Saig_ManPoNum(pAig) );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) )
            continue;
        bBdd0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bBdd1 = Cudd_NotCond( (DdNode *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
        bBdd  = Cudd_bddAnd( dd, bBdd0, bBdd1 );
        if ( bBdd == NULL )
        {
            Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
                if ( Aig_ObjIsNode(pObj) && pObj->pData != NULL )
                    Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
            Vec_PtrFree( vNodes );
            return NULL;
        }
        Cudd_Ref( bBdd );
        pObj->pData = bBdd;
    }
    // quantify PIs of each PO
    bResult = Cudd_ReadLogicZero( dd );  Cudd_Ref( bResult );
    Saig_ManForEachPo( pAig, pObj, i )
    {
        bBdd0   = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bResult = Cudd_bddOr( dd, bTemp = bResult, bBdd0 );     
        if ( bResult == NULL )
        {
            Cudd_RecursiveDeref( dd, bTemp );
            break;
        }
        Cudd_Ref( bResult );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    // deref
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        if ( Aig_ObjIsNode(pObj) && pObj->pData != NULL )
            Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
    Vec_PtrFree( vNodes );
    if ( bResult )
    {
        bCube = Cudd_ReadOne(dd);  Cudd_Ref( bCube );
        Saig_ManForEachPi( pAig, pObj, i )
        {
            bCube = Cudd_bddAnd( dd, bTemp = bCube, (DdNode *)pObj->pData );  
            if ( bCube == NULL )
            {
                Cudd_RecursiveDeref( dd, bTemp );
                Cudd_RecursiveDeref( dd, bResult );
                bResult = NULL;
                break;
            }
            Cudd_Ref( bCube );
            Cudd_RecursiveDeref( dd, bTemp );
        }
        if ( bResult != NULL )
        {
            bResult = Cudd_bddExistAbstract( dd, bTemp = bResult, bCube );  Cudd_Ref( bResult );
            Cudd_RecursiveDeref( dd, bTemp );
            Cudd_RecursiveDeref( dd, bCube );
            Cudd_Deref( bResult );
        }
    }
//if ( bResult )
//printf( "Bad state = %d.\n", Cudd_DagSize(bResult) );
    return bResult;
}